

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_node_base *__lhs;
  cmMakefile *pcVar1;
  bool bVar2;
  ManagedType MVar3;
  char *pcVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  string *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> local_259;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  cmGeneratorExpression ge;
  cmListFileBacktrace local_1d8;
  string langFlagRegexVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&opts,"CMAKE_",(allocator<char> *)&optVec);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts,lang);
  std::operator+(&langFlagRegexVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                 "_FLAG_REGEX");
  std::__cxx11::string::~string((string *)&opts_1);
  std::__cxx11::string::~string((string *)&opts);
  pcVar4 = cmMakefile::GetDefinition(this->Makefile,&langFlagRegexVar);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&opts_1,"COMPILE_FLAGS",(allocator<char> *)&opts);
    pcVar4 = cmGeneratorTarget::GetProperty(target,(string *)&opts_1);
    std::__cxx11::string::~string((string *)&opts_1);
    if (pcVar4 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar4);
    }
    opts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetCompileOptions(target,&opts_1,config,lang);
    AppendCompileOptions(this,flags,&opts_1,(char *)0x0);
    this_00 = &opts_1;
  }
  else {
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&opts_1,"COMPILE_FLAGS",(allocator<char> *)&optVec);
    pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)&opts_1);
    std::__cxx11::string::~string((string *)&opts_1);
    if (pcVar5 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(pcVar5,&opts);
    }
    cmGeneratorTarget::GetCompileOptions(target,&opts,config,lang);
    AppendCompileOptions(this,flags,&opts,pcVar4);
    this_00 = &opts;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  p_Var6 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 ==
        &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header) {
      AddCompilerRequirementFlag(this,flags,target,lang);
      pcVar1 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts,
                     "CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts,
                     "_COMPILE_OPTIONS_JMC");
      pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&opts_1);
      std::__cxx11::string::~string((string *)&opts_1);
      std::__cxx11::string::~string((string *)&opts);
      if (pcVar4 != (char *)0x0) {
        MVar3 = cmGeneratorTarget::GetManagedType(target,config);
        if (MVar3 != Managed) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&opts_1,"VS_JUST_MY_CODE_DEBUGGING",(allocator<char> *)&opts);
          pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)&opts_1);
          std::__cxx11::string::~string((string *)&opts_1);
          if (pcVar5 != (char *)0x0) {
            local_1d8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            local_1d8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cmGeneratorExpression::cmGeneratorExpression(&ge,&local_1d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1d8.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
            opts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&opts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            opts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            opts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)opts.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            psVar8 = cmCompiledGeneratorExpression::Evaluate
                               ((cmCompiledGeneratorExpression *)
                                cge._M_t.
                                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                _M_head_impl,this,config,false,(cmGeneratorTarget *)0x0,
                                (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                                (string *)&opts);
            std::__cxx11::string::string((string *)&opts_1,(string *)psVar8);
            std::__cxx11::string::~string((string *)&opts);
            bVar2 = cmSystemTools::IsOn((string *)&opts_1);
            if (bVar2) {
              optVec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              optVec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              optVec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string<std::allocator<char>>((string *)&opts,pcVar4,&local_259);
              cmSystemTools::ExpandListArgument((string *)&opts,&optVec,false);
              std::__cxx11::string::~string((string *)&opts);
              AppendCompileOptions(this,flags,&optVec,(char *)0x0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&optVec);
            }
            std::__cxx11::string::~string((string *)&opts_1);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&cge);
            cmGeneratorExpression::~cmGeneratorExpression(&ge);
          }
        }
      }
LAB_0028dae0:
      std::__cxx11::string::~string((string *)&langFlagRegexVar);
      return;
    }
    __lhs = p_Var6 + 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   "_STANDARD");
    pcVar4 = cmGeneratorTarget::GetProperty
                       (target,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &opts_1);
    std::__cxx11::string::~string((string *)&opts_1);
    if (pcVar4 != (char *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opts_1,pcVar4,(allocator<char> *)&opts);
      bVar2 = cmMakefile::IsLaterStandard
                        (pcVar1,(string *)__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &opts_1,(string *)(p_Var6 + 2));
      std::__cxx11::string::~string((string *)&opts_1);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&opts_1);
        poVar7 = std::operator<<((ostream *)&opts_1,"The COMPILE_FEATURES property of target \"");
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar7 = std::operator<<(poVar7,(string *)psVar8);
        poVar7 = std::operator<<(poVar7,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar7 = std::operator<<(poVar7,(string *)__lhs);
        poVar7 = std::operator<<(poVar7,"_STANDARD\" was \"");
        poVar7 = std::operator<<(poVar7,(string *)(p_Var6 + 2));
        poVar7 = std::operator<<(poVar7,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar7 = std::operator<<(poVar7,(string *)__lhs);
        poVar7 = std::operator<<(poVar7,"_STANDARD\" \"");
        poVar7 = std::operator<<(poVar7,pcVar4);
        poVar7 = std::operator<<(poVar7,
                                 "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opts_1);
        goto LAB_0028dae0;
      }
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    // (Re-)Escape these flags.  COMPILE_FLAGS were already parsed
    // as a command line above, and COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts, langFlagRegexStr);
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts);
  }

  for (auto const& it : target->GetMaxLanguageStandards()) {
    const char* standard = target->GetProperty(it.first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it.first, standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);

  // Add compile flag for the MSVC compiler only.
  cmMakefile* mf = this->GetMakefile();
  if (const char* jmc =
        mf->GetDefinition("CMAKE_" + lang + "_COMPILE_OPTIONS_JMC")) {

    // Handle Just My Code debugging flags, /JMC.
    // If the target is a Managed C++ one, /JMC is not compatible.
    if (target->GetManagedType(config) !=
        cmGeneratorTarget::ManagedType::Managed) {
      // add /JMC flags if target property VS_JUST_MY_CODE_DEBUGGING is set
      // to ON
      if (char const* jmcExprGen =
            target->GetProperty("VS_JUST_MY_CODE_DEBUGGING")) {
        cmGeneratorExpression ge;
        std::unique_ptr<cmCompiledGeneratorExpression> cge =
          ge.Parse(jmcExprGen);
        std::string isJMCEnabled = cge->Evaluate(this, config);
        if (cmSystemTools::IsOn(isJMCEnabled)) {
          std::vector<std::string> optVec;
          cmSystemTools::ExpandListArgument(jmc, optVec);
          this->AppendCompileOptions(flags, optVec);
        }
      }
    }
  }
}